

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

type_conflict jsteemann::atoi<short>(char *p,char *e,bool *valid)

{
  short sVar1;
  byte bVar2;
  bool bVar3;
  
  if (p == e) {
    *valid = false;
    return 0;
  }
  if (*p == '-') {
    sVar1 = atoi_negative<short>(p + 1,e,valid);
    return sVar1;
  }
  if (*p == '+') {
    sVar1 = atoi_positive<short>(p + 1,e,valid);
    return sVar1;
  }
  if (p == e) {
    bVar3 = false;
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      if ((byte)(*p - 0x3aU) < 0xf6) {
LAB_00128987:
        bVar3 = false;
        goto LAB_00128984;
      }
      bVar2 = *p - 0x30;
      if ((0xccc < sVar1) || (sVar1 == 0xccc && 7 < bVar2)) goto LAB_00128987;
      sVar1 = (ushort)bVar2 + sVar1 * 10;
      p = p + 1;
    } while (p < e);
    bVar3 = true;
  }
LAB_00128984:
  *valid = bVar3;
  return sVar1;
}

Assistant:

inline typename std::enable_if<std::is_signed<T>::value, T>::type atoi(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  if (*p == '-') {
    return atoi_negative<T>(++p, e, valid);
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive<T>(p, e, valid);
}